

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
VectorInstance::op_eraseFromIndex
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  size_type sVar2;
  undefined8 *puVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  const_iterator in_RSI;
  string *in_RDI;
  int from_index;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  *in_stack_ffffffffffffff10;
  allocator *paVar4;
  int iVar5;
  string *this_01;
  const_iterator in_stack_ffffffffffffff38;
  allocator local_b1;
  shared_ptr<Instance> *local_b0;
  string *in_stack_ffffffffffffff58;
  IntegerInstance *in_stack_ffffffffffffff60;
  IntegerInstance local_80;
  int local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  this_01 = in_RDI;
  local_18 = in_RDX;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 != 1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  IntegerInstance::IntegerInstance(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  iVar1 = IntegerInstance::value(&local_80);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1c0d69);
  local_1c = iVar1;
  if (-1 < iVar1) {
    iVar5 = iVar1;
    sVar2 = std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
            size((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 &in_RSI._M_current[7].super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    if (iVar1 <= (int)sVar2) {
      this_00 = &in_RSI._M_current[7].super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
                ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 this_00);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
      ::operator+((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                   *)CONCAT44(iVar5,iVar1),(difference_type)in_stack_ffffffffffffff10);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Instance>const*,std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>>
      ::__normal_iterator<std::shared_ptr<Instance>*>
                (in_stack_ffffffffffffff10,
                 (__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                  *)this_00);
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::end
                ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 this_00);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Instance>const*,std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>>
      ::__normal_iterator<std::shared_ptr<Instance>*>
                (in_stack_ffffffffffffff10,
                 (__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                  *)this_00);
      local_b0 = (shared_ptr<Instance> *)
                 std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ::erase((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                          *)this_01,in_stack_ffffffffffffff38,in_RSI);
      paVar4 = &local_b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,"null",paVar4);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      return this_01;
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_eraseFromIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int from_index = IntegerInstance(arguments[0]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    _value.erase(_value.begin() + from_index, _value.end());
    return "null";
}